

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpConn.cpp
# Opt level: O2

int __thiscall HttpConn::close(HttpConn *this,int __fd)

{
  int *piVar1;
  EventLoop *this_00;
  WebServer *this_01;
  int extraout_EAX;
  __shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2> local_48;
  __shared_ptr<HttpConn,(__gnu_cxx::_Lock_policy)2> local_38 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  
  this->connStatus_ = Disconnected;
  this_00 = this->loop_;
  std::__shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_48,&(this->channel_).super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>);
  EventLoop::removeChannel(this_00,(ChannelPtr *)&local_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
  Channel::clearAll((this->channel_).super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
  ;
  ::close(this->fd_);
  reset(this);
  EventLoop::clearTimer(this->loop_,this->id_);
  piVar1 = &this->loop_->connCnt_;
  *piVar1 = *piVar1 + -1;
  this->linger_ = false;
  this->fd_ = -1;
  this_01 = this->server_;
  std::__shared_ptr<HttpConn,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<HttpConn,void>
            (local_38,(__weak_ptr<HttpConn,_(__gnu_cxx::_Lock_policy)2> *)this);
  WebServer::returnConn(this_01,(HttpConnPtr *)local_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30);
  return extraout_EAX;
}

Assistant:

void HttpConn::close() {
    connStatus_ = Disconnected;
    loop_->removeChannel(channel_);
    channel_->clearAll();
    ::close(fd_); 
    reset();
    loop_->clearTimer(id_);
    loop_->minusConnCnt();
    linger_ = false;
    fd_ = -1;
    server_->returnConn(shared_from_this());
}